

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::reset
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this)

{
  if (this->hasVal == true) {
    DWARFListTableBase<llvm::DWARFDebugRnglist>::~DWARFListTableBase
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)this);
    this->hasVal = false;
  }
  return;
}

Assistant:

void reset() noexcept {
    if (hasVal) {
      value.~T();
      hasVal = false;
    }
  }